

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscStatements.cpp
# Opt level: O0

void __thiscall
slang::ast::ConcurrentAssertionStatement::serializeTo
          (ConcurrentAssertionStatement *this,ASTSerializer *serializer)

{
  ASTSerializer *in_RSI;
  long in_RDI;
  string_view sVar1;
  ASTSerializer *in_stack_ffffffffffffff88;
  ASTSerializer *this_00;
  undefined8 local_60;
  undefined4 local_50;
  undefined8 local_48;
  undefined4 local_40;
  undefined8 local_38;
  undefined4 local_30;
  undefined8 local_28;
  undefined4 local_20;
  undefined8 local_18;
  
  this_00 = in_RSI;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_RSI,
             (char *)in_stack_ffffffffffffff88);
  ASTSerializer::write(this_00,local_20,local_18,*(size_t *)(in_RDI + 0x20));
  if (*(long *)(in_RDI + 0x28) != 0) {
    in_stack_ffffffffffffff88 = in_RSI;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)this_00,(char *)in_RSI);
    ASTSerializer::write(in_stack_ffffffffffffff88,local_30,local_28,*(size_t *)(in_RDI + 0x28));
  }
  if (*(long *)(in_RDI + 0x30) != 0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)this_00,
               (char *)in_stack_ffffffffffffff88);
    ASTSerializer::write(in_RSI,local_40,local_38,*(size_t *)(in_RDI + 0x30));
  }
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)this_00,
             (char *)in_stack_ffffffffffffff88);
  sVar1 = ast::toString(Assert);
  local_60 = sVar1._M_len;
  ASTSerializer::write(in_RSI,local_50,local_48,local_60);
  return;
}

Assistant:

void ConcurrentAssertionStatement::serializeTo(ASTSerializer& serializer) const {
    serializer.write("propertySpec", propertySpec);
    if (ifTrue)
        serializer.write("ifTrue", *ifTrue);
    if (ifFalse)
        serializer.write("ifFalse", *ifFalse);
    serializer.write("assertionKind", toString(assertionKind));
}